

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mapper004.cpp
# Opt level: O0

uint32_t __thiscall Mapper004::calcVBankOffset(Mapper004 *this,uint8_t idx)

{
  int32_t offset;
  uint8_t idx_local;
  Mapper004 *this_local;
  
  return (uint)(byte)((ulong)idx %
                     (ulong)(long)(int)(((uint)this->params->sizeChrRom << 0xd) / 0x400)) * 0x400;
}

Assistant:

uint32_t Mapper004::calcVBankOffset(uint8_t idx) {
    if (idx > 0x80) {
        idx -= 0x100;
    }
    idx %= ((params->sizeChrRom * 8192) / 0x0400);
    int32_t offset = idx * 0x0400;
    if (offset < 0) {
        offset += (params->sizeChrRom * 8192);
    }
    return uint32_t(offset);
}